

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPSender.hpp
# Opt level: O0

void __thiscall Statsd::UDPSender::~UDPSender(UDPSender *this)

{
  bool bVar1;
  UDPSender *this_local;
  
  bVar1 = initialized(this);
  if (bVar1) {
    bVar1 = std::thread::joinable(&this->m_batchingThread);
    if (bVar1) {
      std::atomic<bool>::store(&this->m_mustExit,true,memory_order_release);
      std::thread::join();
    }
    close(this->m_socket);
  }
  std::__cxx11::string::~string((string *)&this->m_errorMessage);
  std::thread::~thread(&this->m_batchingThread);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&this->m_batchingMessageQueue);
  std::__cxx11::string::~string((string *)&this->m_host);
  return;
}

Assistant:

inline UDPSender::~UDPSender() {
    if (!initialized()) {
        return;
    }

    // If we're running a background thread tell it to stop
    if (m_batchingThread.joinable()) {
        m_mustExit.store(true, std::memory_order_release);
        m_batchingThread.join();
    }

    // Cleanup the socket
    SOCKET_CLOSE(m_socket);
}